

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

Vec_Int_t * Gia_ManInsertOrder(Gia_Man_t *p,Vec_Int_t *vObjs,Vec_Wec_t *vFuncs)

{
  int iVar1;
  Vec_Int_t *vNodes_00;
  Gia_Obj_t *pObj;
  bool bVar2;
  Vec_Int_t *vNodes;
  int Id;
  int i;
  Vec_Wec_t *vFuncs_local;
  Vec_Int_t *vObjs_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  vNodes_00 = Vec_IntAlloc(iVar1);
  vNodes._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar2 = false;
    if (vNodes._4_4_ < iVar1) {
      pObj = Gia_ManCo(p,vNodes._4_4_);
      vNodes._0_4_ = Gia_ObjId(p,pObj);
      bVar2 = (int)vNodes != 0;
    }
    if (!bVar2) break;
    Gia_ManInsertOrder_rec(p,(int)vNodes,vObjs,vFuncs,vNodes_00);
    vNodes._4_4_ = vNodes._4_4_ + 1;
  }
  return vNodes_00;
}

Assistant:

Vec_Int_t * Gia_ManInsertOrder( Gia_Man_t * p, Vec_Int_t * vObjs, Vec_Wec_t * vFuncs )
{
    int i, Id;
    Vec_Int_t * vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachCoId( p, Id, i )
        Gia_ManInsertOrder_rec( p, Id, vObjs, vFuncs, vNodes );
    return vNodes;
}